

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_stswi(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 EA;
  TCGv_i32 arg3;
  TCGv_i32 arg4;
  uint val;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_2;
  
  if (ctx->le_mode == true) {
    gen_align_no_le(ctx);
    return;
  }
  val = ctx->opcode >> 0xb & 0x1f;
  tcg_ctx = ctx->uc->tcg_ctx;
  gen_set_access_type(ctx,0x20);
  EA = tcg_temp_new_i64(tcg_ctx);
  gen_addr_register(ctx,EA);
  if (val == 0) {
    val = 0x20;
  }
  arg3 = tcg_const_i32_ppc64(tcg_ctx,val);
  arg4 = tcg_const_i32_ppc64(tcg_ctx,ctx->opcode >> 0x15 & 0x1f);
  gen_helper_stsw(tcg_ctx,tcg_ctx->cpu_env,EA,arg3,arg4);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg3 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg4 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_stswi(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv_i32 t1, t2;
    int nb = NB(ctx->opcode);

    if (ctx->le_mode) {
        gen_align_no_le(ctx);
        return;
    }
    gen_set_access_type(ctx, ACCESS_INT);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_register(ctx, t0);
    if (nb == 0) {
        nb = 32;
    }
    t1 = tcg_const_i32(tcg_ctx, nb);
    t2 = tcg_const_i32(tcg_ctx, rS(ctx->opcode));
    gen_helper_stsw(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
}